

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

EndsWithMatcher *
Catch::Matchers::EndsWith
          (EndsWithMatcher *__return_storage_ptr__,string *str,Choice caseSensitivity)

{
  CasedString local_48;
  Choice local_1c;
  string *psStack_18;
  Choice caseSensitivity_local;
  string *str_local;
  
  local_1c = caseSensitivity;
  psStack_18 = str;
  str_local = (string *)__return_storage_ptr__;
  StdString::CasedString::CasedString(&local_48,str,caseSensitivity);
  StdString::EndsWithMatcher::EndsWithMatcher(__return_storage_ptr__,&local_48);
  StdString::CasedString::~CasedString(&local_48);
  return __return_storage_ptr__;
}

Assistant:

StdString::EndsWithMatcher EndsWith(std::string const& str, CaseSensitive::Choice caseSensitivity) {
            return StdString::EndsWithMatcher(StdString::CasedString(str, caseSensitivity));
        }